

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void madd(double *A,double *B,double *C,int rows,int cols)

{
  ulong uVar1;
  
  if (0 < rows * cols) {
    uVar1 = 0;
    do {
      C[uVar1] = A[uVar1] + B[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)(rows * cols) != uVar1);
  }
  return;
}

Assistant:

void madd(double* A, double* B, double* C,int rows,int cols) {
	int N,i;
	/*
	 * C = A + B . All matrices have identical dimensions rows X cols
	 */ 
	 
	N = rows * cols;
	
	#pragma omp parallel for
	for (i = 0; i < N; ++i) {
		C[i] = A[i] + B[i];
	}
}